

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O3

void __thiscall Wasm::WasmBinaryReader::ReadSignatureTypeSection(WasmBinaryReader *this)

{
  code *pcVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  WasmType WVar5;
  uint sourceContextId;
  undefined4 *puVar6;
  WasmSignature *this_00;
  Recycler *pRVar7;
  FunctionInfo *pFVar8;
  uint uVar9;
  char16_t *msg;
  WasmBinaryReader *pWVar10;
  ArgSlot index;
  uint32 uVar11;
  FunctionBody *pFVar12;
  uint32 local_40;
  uint local_3c;
  uint32 len;
  uint32 local_34;
  
  local_40 = 0;
  pWVar10 = this;
  uVar4 = LEB128<unsigned_int,32u>(this,&local_40);
  len = uVar4;
  if ((1000000 < uVar4) && (DAT_015932e2 == 0)) {
    msg = L"Too many signatures";
LAB_00f11901:
    ThrowDecodingError(pWVar10,msg);
  }
  Js::WebAssemblyModule::SetSignatureCount(this->m_module,uVar4);
  if (uVar4 != 0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar11 = 0;
    do {
      this_00 = Js::WebAssemblyModule::GetSignature(this->m_module,uVar11);
      local_34 = uVar11;
      WasmSignature::SetSignatureId(this_00,uVar11);
      pWVar10 = this;
      cVar2 = LEB128<char,7u>(this,&local_40);
      if (cVar2 != -0x20) {
        ThrowDecodingError(pWVar10,L"Unexpected type form 0x%X",(ulong)(uint)(int)cVar2);
      }
      pWVar10 = this;
      uVar4 = LEB128<unsigned_int,32u>(this,&local_40);
      if ((0xffff < uVar4) || ((1000 < uVar4 & (DAT_015932e2 ^ 1)) != 0)) {
        msg = L"Too many arguments in signature";
        goto LAB_00f11901;
      }
      pRVar7 = Js::RecyclableObject::GetRecycler((RecyclableObject *)this->m_module);
      WasmSignature::AllocateParams(this_00,(ArgSlot)uVar4,pRVar7);
      if (uVar4 != 0) {
        index = 0;
        do {
          cVar2 = LEB128<char,7u>(this,&local_40);
          WVar5 = LanguageTypes::ToWasmType(cVar2);
          WasmSignature::SetParam(this_00,WVar5,index);
          index = index + 1;
        } while (index < (ArgSlot)uVar4);
      }
      pWVar10 = this;
      uVar4 = LEB128<unsigned_int,32u>(this,&local_40);
      uVar9 = 10000;
      if ((DAT_015932e2 & 1) != 0) {
        uVar9 = 0xfffffffe;
      }
      if (DAT_015932ed == '\0') {
        uVar9 = 1;
      }
      if (uVar9 < uVar4) {
        ThrowDecodingError(pWVar10,L"Too many returns in signature: %u. Maximum allowed: %u",
                           (ulong)uVar4);
      }
      pRVar7 = Js::RecyclableObject::GetRecycler((RecyclableObject *)this->m_module);
      WasmSignature::AllocateResults(this_00,uVar4,pRVar7);
      if (uVar4 != 0) {
        uVar11 = 0;
        do {
          cVar2 = LEB128<char,7u>(this,&local_40);
          WVar5 = LanguageTypes::ToWasmType(cVar2);
          WasmSignature::SetResult(this_00,WVar5,uVar11);
          uVar11 = uVar11 + 1;
        } while (uVar4 != uVar11);
      }
      WasmSignature::FinalizeSignature(this_00);
      pFVar12 = (this->m_funcState).body;
      if (pFVar12 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,WasmReaderPhase);
        uVar11 = local_34;
        if (bVar3) {
LAB_00f11805:
          Output::Print(L"Signature #%u: ",(ulong)uVar11);
          WasmSignature::Dump(this_00,0x200);
          Output::Print(L"\n");
        }
      }
      else {
        sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
        if (this->m_readerState == READER_STATE_FUNCTION) {
          pFVar12 = (this->m_funcState).body;
        }
        else {
          pFVar12 = (FunctionBody *)0x0;
        }
        pFVar8 = (pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar8 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          local_3c = sourceContextId;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
          pFVar8 = (pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
          sourceContextId = local_3c;
        }
        uVar11 = local_34;
        bVar3 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015b6718,WasmReaderPhase,sourceContextId,
                           pFVar8->functionId);
        if (bVar3) goto LAB_00f11805;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != len);
  }
  return;
}

Assistant:

void WasmBinaryReader::ReadSignatureTypeSection()
{
    uint32 len = 0;
    const uint32 numTypes = LEB128(len);
    if (numTypes > Limits::GetMaxTypes())
    {
        ThrowDecodingError(_u("Too many signatures"));
    }

    m_module->SetSignatureCount(numTypes);
    // signatures table
    for (uint32 i = 0; i < numTypes; i++)
    {
        WasmSignature* sig = m_module->GetSignature(i);
        sig->SetSignatureId(i);
        int8 form = SLEB128<int8, 7>(len);
        if (form != LanguageTypes::func)
        {
            ThrowDecodingError(_u("Unexpected type form 0x%X"), form);
        }

        uint32 paramCount32 = LEB128(len);
        if (paramCount32 > Limits::GetMaxFunctionParams() || paramCount32 > UINT16_MAX)
        {
            ThrowDecodingError(_u("Too many arguments in signature"));
        }

        Js::ArgSlot paramCount = (Js::ArgSlot)paramCount32;
        sig->AllocateParams(paramCount, m_module->GetRecycler());
        for (Js::ArgSlot j = 0; j < paramCount; j++)
        {
            WasmTypes::WasmType type = ReadWasmType(len);
            sig->SetParam(type, j);
        }

        uint32 resultCount = LEB128(len);
        if (resultCount > Limits::GetMaxFunctionReturns())
        {
            ThrowDecodingError(_u("Too many returns in signature: %u. Maximum allowed: %u"), resultCount, Limits::GetMaxFunctionReturns());
        }
        sig->AllocateResults(resultCount, m_module->GetRecycler());
        for (uint32 iResult = 0; iResult < resultCount; ++iResult)
        {
            WasmTypes::WasmType type = ReadWasmType(len);
            sig->SetResult(type, iResult);
        }
        sig->FinalizeSignature();
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (DO_WASM_TRACE_DECODER)
        {
            Output::Print(_u("Signature #%u: "), i);
            sig->Dump();
            Output::Print(_u("\n"));
        }
#endif
    }
}